

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O0

void Hop_ManStop(Hop_Man_t *p)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  void *pvVar3;
  int local_1c;
  int i;
  Hop_Obj_t *pObj;
  Hop_Man_t *p_local;
  
  pHVar2 = Hop_ManConst1(p);
  if (((*(uint *)&pHVar2->field_0x20 >> 4 & 1) == 0) &&
     ((*(uint *)&pHVar2->field_0x20 >> 5 & 1) == 0)) {
    local_1c = 0;
    while( true ) {
      iVar1 = Vec_PtrSize(p->vPis);
      if (iVar1 <= local_1c) {
        local_1c = 0;
        while( true ) {
          iVar1 = Vec_PtrSize(p->vPos);
          if (iVar1 <= local_1c) {
            local_1c = 0;
            while( true ) {
              if (p->nTableSize <= local_1c) {
                if (p->time1 != 0) {
                  Abc_Print(1,"%s =","time1");
                  Abc_Print(1,"%9.2f sec\n",((double)p->time1 * 1.0) / 1000000.0);
                }
                if (p->time2 != 0) {
                  Abc_Print(1,"%s =","time2");
                  Abc_Print(1,"%9.2f sec\n",((double)p->time2 * 1.0) / 1000000.0);
                }
                if (p->vChunks != (Vec_Ptr_t *)0x0) {
                  Hop_ManStopMemory(p);
                }
                if (p->vPis != (Vec_Ptr_t *)0x0) {
                  Vec_PtrFree(p->vPis);
                }
                if (p->vPos != (Vec_Ptr_t *)0x0) {
                  Vec_PtrFree(p->vPos);
                }
                if (p->vObjs != (Vec_Ptr_t *)0x0) {
                  Vec_PtrFree(p->vObjs);
                }
                if (p->pTable != (Hop_Obj_t **)0x0) {
                  free(p->pTable);
                  p->pTable = (Hop_Obj_t **)0x0;
                }
                if (p != (Hop_Man_t *)0x0) {
                  free(p);
                }
                return;
              }
              pHVar2 = p->pTable[local_1c];
              if ((pHVar2 != (Hop_Obj_t *)0x0) &&
                 (((*(uint *)&pHVar2->field_0x20 >> 4 & 1) != 0 ||
                  ((*(uint *)&pHVar2->field_0x20 >> 5 & 1) != 0)))) break;
              local_1c = local_1c + 1;
            }
            __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                          ,0x60,"void Hop_ManStop(Hop_Man_t *)");
          }
          pvVar3 = Vec_PtrEntry(p->vPos,local_1c);
          if (((*(uint *)((long)pvVar3 + 0x20) >> 4 & 1) != 0) ||
             ((*(uint *)((long)pvVar3 + 0x20) >> 5 & 1) != 0)) break;
          local_1c = local_1c + 1;
        }
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                      ,0x5e,"void Hop_ManStop(Hop_Man_t *)");
      }
      pvVar3 = Vec_PtrEntry(p->vPis,local_1c);
      if (((*(uint *)((long)pvVar3 + 0x20) >> 4 & 1) != 0) ||
         ((*(uint *)((long)pvVar3 + 0x20) >> 5 & 1) != 0)) break;
      local_1c = local_1c + 1;
    }
    __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                  ,0x5c,"void Hop_ManStop(Hop_Man_t *)");
  }
  __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                ,0x5a,"void Hop_ManStop(Hop_Man_t *)");
}

Assistant:

void Hop_ManStop( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    // make sure the nodes have clean marks
    pObj = Hop_ManConst1(p);
    assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachPi( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachPo( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachNode( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // print time
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
//    Hop_TableProfile( p );
    if ( p->vChunks )  Hop_ManStopMemory( p );
    if ( p->vPis )     Vec_PtrFree( p->vPis );
    if ( p->vPos )     Vec_PtrFree( p->vPos );
    if ( p->vObjs )    Vec_PtrFree( p->vObjs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}